

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O2

CompiledFilter __thiscall
Rml::FilterDropShadow::CompileFilter(FilterDropShadow *this,Element *element)

{
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  long lVar1;
  CompiledFilter CVar2;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_1c3;
  key_compare local_1c2;
  allocator<char> local_1c1;
  float local_1c0;
  float sigma;
  Vector2f offset;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_1b0;
  Dictionary local_198;
  Variant local_178;
  Variant local_150;
  Variant local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_100 [3];
  
  sigma = Element::ResolveLength
                    (in_RDX,*(NumericValue *)
                             ((long)&(element->children).
                                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 4));
  local_1c0 = Element::ResolveLength
                        (in_RDX,*(NumericValue *)
                                 ((long)&(element->super_EnableObserverPtr<Rml::Element>).block + 4)
                        );
  offset.y = Element::ResolveLength(in_RDX,*(NumericValue *)&element->visible);
  offset.x = local_1c0;
  name = Element::GetRenderManager(in_RDX);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"drop-shadow",&local_1c1);
  Variant::Variant<Rml::Colour<unsigned_char,255,false>const&,void>
            (&local_128,
             (Colour<unsigned_char,_255,_false> *)&element->super_EnableObserverPtr<Rml::Element>);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(local_100,(char (*) [6])0x3229a5,&local_128);
  Variant::Variant<Rml::Vector2<float>const&,void>(&local_150,&offset);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[7],_Rml::Variant,_true>(local_100 + 1,(char (*) [7])"offset",&local_150);
  Variant::Variant<float_const&,void>(&local_178,&sigma);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(local_100 + 2,(char (*) [6])0x3228d5,&local_178);
  init._M_len = 3;
  init._M_array = local_100;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_1b0,init,&local_1c2,&local_1c3);
  RenderManager::CompileFilter((RenderManager *)this,(String *)name,&local_198);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_1b0.m_container);
  lVar1 = 0x90;
  do {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
             *)(local_100[0].second.data + lVar1 + -0x28));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  Variant::~Variant(&local_178);
  Variant::~Variant(&local_150);
  Variant::~Variant(&local_128);
  ::std::__cxx11::string::~string((string *)&local_198);
  CVar2.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle =
       extraout_RDX;
  CVar2.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar2.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterDropShadow::CompileFilter(Element* element) const
{
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	CompiledFilter filter = element->GetRenderManager()->CompileFilter("drop-shadow",
		Dictionary{{"color", Variant(color)}, {"offset", Variant(offset)}, {"sigma", Variant(sigma)}});

	return filter;
}